

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.cpp
# Opt level: O0

void __thiscall
QueryDatabaseSearcherWorker<DNA>::Process
          (QueryDatabaseSearcherWorker<DNA> *this,SequenceList<DNA> *queries)

{
  _Map_pointer this_00;
  bool bVar1;
  pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_> local_1c8;
  undefined4 local_118;
  undefined1 local_108 [8];
  HitList<DNA> hits;
  Sequence<DNA> *query;
  const_iterator __end0;
  const_iterator __begin0;
  SequenceList<DNA> *__range2;
  QueryWithHitsList<DNA> list;
  SequenceList<DNA> *queries_local;
  QueryDatabaseSearcherWorker<DNA> *this_local;
  
  list.
  super__Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)queries;
  std::
  deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
  ::deque((deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
           *)&__range2);
  this_00 = list.
            super__Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>::begin
            ((const_iterator *)&__end0._M_node,
             (deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_> *)
             list.
             super__Deque_base<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>::end
            ((const_iterator *)&query,
             (deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_> *)this_00);
  while (bVar1 = std::operator!=((_Self *)&__end0._M_node,(_Self *)&query), bVar1) {
    hits.super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_node =
         (_Map_pointer)
         std::_Deque_iterator<Sequence<DNA>,_const_Sequence<DNA>_&,_const_Sequence<DNA>_*>::
         operator*((_Deque_iterator<Sequence<DNA>,_const_Sequence<DNA>_&,_const_Sequence<DNA>_*> *)
                   &__end0._M_node);
    Search<DNA>::Query((HitList<DNA> *)local_108,(Search<DNA> *)this,
                       (Sequence<DNA> *)
                       hits.super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node);
    bVar1 = std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>::empty
                      ((deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_> *)local_108);
    if (bVar1) {
      local_118 = 3;
    }
    else {
      std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>::
      pair<std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_&,_true>
                (&local_1c8,
                 (Sequence<DNA> *)
                 hits.super__Deque_base<Hit<DNA>,_std::allocator<Hit<DNA>_>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node,
                 (deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_> *)local_108);
      std::
      deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
      ::push_back((deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
                   *)&__range2,&local_1c8);
      std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>::~pair(&local_1c8)
      ;
      local_118 = 0;
    }
    std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>::~deque
              ((deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_> *)local_108);
    std::_Deque_iterator<Sequence<DNA>,_const_Sequence<DNA>_&,_const_Sequence<DNA>_*>::operator++
              ((_Deque_iterator<Sequence<DNA>,_const_Sequence<DNA>_&,_const_Sequence<DNA>_*> *)
               &__end0._M_node);
  }
  bVar1 = std::
          deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
          ::empty((deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
                   *)&__range2);
  if (!bVar1) {
    WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::Enqueue((WorkerQueue<SearchResultsWriterWorker<DNA>,_std::deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               *)this->mWriter,
              (deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
               *)&__range2);
  }
  std::
  deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
  ::~deque((deque<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>,_std::allocator<std::pair<Sequence<DNA>,_std::deque<Hit<DNA>,_std::allocator<Hit<DNA>_>_>_>_>_>
            *)&__range2);
  return;
}

Assistant:

void Process( const SequenceList< A >& queries ) {
    QueryWithHitsList< A > list;

    for( auto& query : queries ) {
      auto hits = mGlobalSearch.Query( query );
      if( hits.empty() )
        continue;

      list.push_back( { query, hits } );
    }

    if( !list.empty() ) {
      mWriter.Enqueue( list );
    }
  }